

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<false> * __thiscall
BaseState<false>::Key
          (BaseState<false> *this,Context<false> *ctx,char *str,SizeType len,bool param_4)

{
  stringstream *psVar1;
  ostream *poVar2;
  
  psVar1 = Context<false>::error_abi_cxx11_(ctx);
  poVar2 = std::operator<<((ostream *)(psVar1 + 0x10),"Unexpected token: key(\'");
  poVar2 = std::operator<<(poVar2,str);
  poVar2 = std::operator<<(poVar2,"\' len: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,")");
  return (BaseState<false> *)0x0;
}

Assistant:

virtual BaseState<audit>* Key(Context<audit>& ctx, const char* str, rapidjson::SizeType len, bool /* copy */)
  {
    ctx.error() << "Unexpected token: key('" << str << "' len: " << len << ")";
    return nullptr;
  }